

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
::removeColRange(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *this,int start,int end,int *perm)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int *piVar7;
  long lVar8;
  uint n;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  DataArray<int> p;
  int *local_30;
  undefined8 local_28;
  
  if (perm != (int *)0x0) {
    if (start < 1) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      do {
        perm[uVar6] = (int)uVar6;
        uVar6 = uVar6 + 1;
      } while ((uint)start != uVar6);
    }
    if ((int)uVar6 <= end) {
      memset(perm + (uVar6 & 0xffffffff),0xff,(ulong)(uint)(end - (int)uVar6) * 4 + 4);
      uVar6 = (ulong)(end + 1);
    }
    if ((int)uVar6 <
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .set.thenum) {
      piVar7 = perm + (uVar6 & 0xffffffff);
      do {
        *piVar7 = (int)uVar6;
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        piVar7 = piVar7 + 1;
      } while ((int)uVar5 <
               (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               .set.thenum);
    }
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[0x17])(this,perm);
    return;
  }
  iVar12 = end - start;
  uVar5 = iVar12 + 1;
  local_30 = (int *)0x0;
  local_28 = 0x3ff3333333333333;
  uVar4 = 0;
  if (0 < (int)uVar5) {
    uVar4 = uVar5;
  }
  n = 1;
  if (-1 < iVar12) {
    n = uVar4;
  }
  spx_alloc<int*>(&local_30,n);
  auVar3 = _DAT_003581b0;
  auVar2 = _DAT_003581a0;
  auVar1 = _DAT_00358190;
  if (-1 < iVar12) {
    lVar8 = (long)(int)uVar5;
    lVar9 = 1;
    if (1 < lVar8) {
      lVar9 = lVar8;
    }
    lVar10 = lVar9 + -1;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar13 = auVar13 ^ _DAT_003581b0;
    lVar11 = 0;
    do {
      auVar15._8_4_ = (int)lVar11;
      auVar15._0_8_ = lVar11;
      auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar16 = (auVar15 | auVar2) ^ auVar3;
      iVar14 = auVar13._4_4_;
      iVar12 = (int)lVar10;
      if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                  iVar14 < auVar16._4_4_) & 1)) {
        local_30[lVar8 + lVar10 + -1] = end + iVar12;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        local_30[lVar8 + lVar10 + -2] = end + -1 + iVar12;
      }
      auVar15 = (auVar15 | auVar1) ^ auVar3;
      iVar17 = auVar15._4_4_;
      if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar15._0_4_ <= auVar13._0_4_)) {
        local_30[lVar8 + lVar10 + -3] = end + -2 + iVar12;
        local_30[lVar8 + lVar10 + -4] = end + -3 + iVar12;
      }
      lVar11 = lVar11 + 4;
      lVar10 = lVar10 + -4;
    } while (-lVar10 != (ulong)((int)lVar9 + 3U & 0xfffffffc));
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._vptr_ClassArray[0x19])(this,local_30,(ulong)uVar5,0);
  if (local_30 != (int *)0x0) {
    free(local_30);
  }
  return;
}

Assistant:

virtual void removeColRange(int start, int end, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         int i = end - start + 1;
         DataArray < int > p(i);

         while(--i >= 0)
            p[i] = start + i;

         removeCols(p.get_ptr(), end - start + 1);
         return;
      }

      int i;

      for(i = 0; i < start; ++i)
         perm[i] = i;

      for(; i <= end; ++i)
         perm[i] = -1;

      for(; i < nCols(); ++i)
         perm[i] = i;

      removeCols(perm);
   }